

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall DifferingTypesTest::assignmentTest(DifferingTypesTest *this)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  reference psVar6;
  reference pfVar7;
  reference piVar8;
  reference psVar9;
  logic_error *plVar10;
  runtime_error *prVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar38 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar43 [16];
  View<short,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  size_t shape_1 [3];
  undefined1 local_100 [16];
  size_t *local_f0;
  size_t *psStack_e8;
  size_t *local_e0;
  size_t sStack_d8;
  ulong local_d0;
  CoordinateOrder local_c8;
  bool local_c4;
  undefined1 local_b8 [8];
  geometry_type gStack_b0;
  unsigned_long local_68 [3];
  short *local_50;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_48;
  
  local_b8 = (undefined1  [8])0x3;
  gStack_b0._0_8_ = 2;
  gStack_b0.shape_ = (size_t *)0x4;
  local_100._0_8_ = this->dataShort_;
  local_50 = (short *)local_100._0_8_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_100 + 8),(unsigned_long *)local_b8,
             (unsigned_long *)(local_b8 + 0x18),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_68);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_100);
  local_68[0] = CONCAT62(local_68[0]._2_6_,2);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::operator=
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_100,(short *)local_68);
  if (local_d0 != 0) {
    sVar14 = 0;
    do {
      psVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_100,sVar14);
      if (*psVar6 != 2) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 < local_d0);
  }
  operator_delete(local_f0,sStack_d8 * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_100._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_100 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  local_b8 = (undefined1  [8])0x0;
  gStack_b0.shape_ = (size_t *)0x0;
  gStack_b0.shapeStrides_ = (size_t *)0x0;
  gStack_b0.strides_ = (size_t *)0x0;
  gStack_b0.dimension_ = 0;
  gStack_b0.size_ = 0;
  gStack_b0.coordinateOrder_ = LastMajorOrder;
  gStack_b0.isSimple_ = true;
  andres::View<float,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_b8);
  andres::View<float,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_b8);
  andres::marray_detail::
  AssignmentOperatorHelper<true,_int,_float,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
  ::execute<false>((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,
                   (View<float,_true,_std::allocator<unsigned_long>_> *)local_b8);
  andres::View<float,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_b8);
  if (local_d0 != 0) {
    sVar14 = 0;
    do {
      pfVar7 = andres::View<float,_true,_std::allocator<unsigned_long>_>::operator()
                         ((View<float,_true,_std::allocator<unsigned_long>_> *)local_b8,sVar14);
      if ((*pfVar7 != (float)this->dataInt_[sVar14]) ||
         (NAN(*pfVar7) || NAN((float)this->dataInt_[sVar14]))) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 < local_d0);
  }
  operator_delete(gStack_b0.shape_,gStack_b0.dimension_ * 0x18);
  operator_delete(local_f0,sStack_d8 * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_100._0_8_ = local_50;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_100 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b8);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_100);
  local_b8 = (undefined1  [8])this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b8 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_48);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8);
  andres::
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  ::BinaryViewExpression
            (&local_48,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             local_100,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             local_100);
  andres::marray_detail::
  operate<andres::marray_detail::Assign<int,short>,int,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
            (local_b8,&local_48);
  if (gStack_b0.size_ != 0) {
    sVar14 = 0;
    do {
      piVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8,sVar14);
      iVar36 = *piVar8;
      andres::
      BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
      ::BinaryViewExpression
                (&local_48,
                 (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                  *)local_100,
                 (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                  *)local_100);
      psVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         (local_48.e1_,sVar14);
      psVar9 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         (local_48.e2_,sVar14);
      if (iVar36 != (short)(*psVar9 + *psVar6)) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 < gStack_b0.size_);
  }
  operator_delete(gStack_b0.shape_,gStack_b0.dimension_ * 0x18);
  operator_delete(local_f0,sStack_d8 * 0x18);
  local_b8 = (undefined1  [8])0x3;
  gStack_b0._0_8_ = 2;
  gStack_b0.shape_ = (size_t *)0x4;
  local_68[0] = local_68[0] & 0xffffffffffff0000;
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)local_100,(unsigned_long *)local_b8,
             (unsigned_long *)(local_b8 + 0x18),(short *)local_68,&andres::defaultOrder,
             (allocator_type *)&local_48);
  auVar5 = _DAT_002380d0;
  if ((short *)local_100._0_8_ == (short *)0x0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"Assertion failed.");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_d0 == 0) {
    local_d0 = 0;
  }
  else {
    lVar12 = local_d0 - 1;
    auVar15._8_4_ = (int)lVar12;
    auVar15._0_8_ = lVar12;
    auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar13 = 0;
    auVar15 = auVar15 ^ _DAT_002380d0;
    auVar18 = _DAT_002380e0;
    auVar19 = _DAT_002380f0;
    auVar20 = _DAT_00238070;
    auVar21 = _DAT_00238080;
    do {
      auVar22 = auVar21 ^ auVar5;
      iVar36 = auVar15._0_4_;
      iVar35 = -(uint)(iVar36 < auVar22._0_4_);
      iVar16 = auVar15._4_4_;
      auVar23._4_4_ = -(uint)(iVar16 < auVar22._4_4_);
      iVar40 = auVar15._8_4_;
      iVar39 = -(uint)(iVar40 < auVar22._8_4_);
      iVar17 = auVar15._12_4_;
      auVar23._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
      auVar32._4_4_ = iVar35;
      auVar32._0_4_ = iVar35;
      auVar32._8_4_ = iVar39;
      auVar32._12_4_ = iVar39;
      auVar41 = pshuflw(in_XMM11,auVar32,0xe8);
      auVar25._4_4_ = -(uint)(auVar22._4_4_ == iVar16);
      auVar25._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
      auVar25._0_4_ = auVar25._4_4_;
      auVar25._8_4_ = auVar25._12_4_;
      auVar43 = pshuflw(in_XMM12,auVar25,0xe8);
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar42 = pshuflw(auVar41,auVar23,0xe8);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar42 | auVar43 & auVar41) ^ auVar22;
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(local_100._0_8_ + uVar13 * 2) = 2;
      }
      auVar23 = auVar25 & auVar32 | auVar23;
      auVar22 = packssdw(auVar23,auVar23);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 ^ auVar42,auVar22 ^ auVar42);
      if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
        *(short *)(local_100._0_8_ + (uVar13 + 1) * 2) = 2;
      }
      auVar22 = auVar20 ^ auVar5;
      iVar35 = -(uint)(iVar36 < auVar22._0_4_);
      auVar37._4_4_ = -(uint)(iVar16 < auVar22._4_4_);
      iVar39 = -(uint)(iVar40 < auVar22._8_4_);
      auVar37._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
      auVar24._4_4_ = iVar35;
      auVar24._0_4_ = iVar35;
      auVar24._8_4_ = iVar39;
      auVar24._12_4_ = iVar39;
      auVar31._4_4_ = -(uint)(auVar22._4_4_ == iVar16);
      auVar31._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar22 = auVar31 & auVar24 | auVar37;
      auVar22 = packssdw(auVar22,auVar22);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 ^ auVar3,auVar22 ^ auVar3);
      if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(local_100._0_8_ + (uVar13 + 2) * 2) = 2;
      }
      auVar25 = pshufhw(auVar24,auVar24,0x84);
      auVar32 = pshufhw(auVar31,auVar31,0x84);
      auVar23 = pshufhw(auVar25,auVar37,0x84);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar26 = (auVar23 | auVar32 & auVar25) ^ auVar26;
      auVar25 = packssdw(auVar26,auVar26);
      if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(local_100._0_8_ + (uVar13 + 3) * 2) = 2;
      }
      auVar25 = auVar19 ^ auVar5;
      iVar35 = -(uint)(iVar36 < auVar25._0_4_);
      auVar28._4_4_ = -(uint)(iVar16 < auVar25._4_4_);
      iVar39 = -(uint)(iVar40 < auVar25._8_4_);
      auVar28._12_4_ = -(uint)(iVar17 < auVar25._12_4_);
      auVar33._4_4_ = iVar35;
      auVar33._0_4_ = iVar35;
      auVar33._8_4_ = iVar39;
      auVar33._12_4_ = iVar39;
      auVar22 = pshuflw(auVar22,auVar33,0xe8);
      auVar27._4_4_ = -(uint)(auVar25._4_4_ == iVar16);
      auVar27._12_4_ = -(uint)(auVar25._12_4_ == iVar17);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      in_XMM12 = pshuflw(auVar43 & auVar41,auVar27,0xe8);
      in_XMM12 = in_XMM12 & auVar22;
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar22 = pshuflw(auVar22,auVar28,0xe8);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar22 | in_XMM12) ^ auVar41;
      auVar22 = packssdw(auVar41,auVar41);
      if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(local_100._0_8_ + (uVar13 + 4) * 2) = 2;
      }
      auVar28 = auVar27 & auVar33 | auVar28;
      auVar22 = packssdw(auVar28,auVar28);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 ^ auVar43,auVar22 ^ auVar43);
      if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(short *)(local_100._0_8_ + (uVar13 + 5) * 2) = 2;
      }
      auVar22 = auVar18 ^ auVar5;
      iVar36 = -(uint)(iVar36 < auVar22._0_4_);
      auVar38._4_4_ = -(uint)(iVar16 < auVar22._4_4_);
      iVar40 = -(uint)(iVar40 < auVar22._8_4_);
      auVar38._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
      auVar29._4_4_ = iVar36;
      auVar29._0_4_ = iVar36;
      auVar29._8_4_ = iVar40;
      auVar29._12_4_ = iVar40;
      auVar34._4_4_ = -(uint)(auVar22._4_4_ == iVar16);
      auVar34._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar22 = auVar34 & auVar29 | auVar38;
      auVar22 = packssdw(auVar22,auVar22);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar22 ^ auVar4,auVar22 ^ auVar4);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(local_100._0_8_ + (uVar13 + 6) * 2) = 2;
      }
      auVar22 = pshufhw(auVar29,auVar29,0x84);
      auVar23 = pshufhw(auVar34,auVar34,0x84);
      auVar25 = pshufhw(auVar22,auVar38,0x84);
      auVar30._8_4_ = 0xffffffff;
      auVar30._0_8_ = 0xffffffffffffffff;
      auVar30._12_4_ = 0xffffffff;
      auVar30 = (auVar25 | auVar23 & auVar22) ^ auVar30;
      auVar22 = packssdw(auVar30,auVar30);
      if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(local_100._0_8_ + (uVar13 + 7) * 2) = 2;
      }
      uVar13 = uVar13 + 8;
      lVar12 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 8;
      auVar21._8_8_ = lVar12 + 8;
      lVar12 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 8;
      auVar20._8_8_ = lVar12 + 8;
      lVar12 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 8;
      auVar19._8_8_ = lVar12 + 8;
      lVar12 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 8;
      auVar18._8_8_ = lVar12 + 8;
    } while ((local_d0 + 7 & 0xfffffffffffffff8) != uVar13);
    sVar14 = 0;
    do {
      psVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_100,sVar14);
      if (*psVar6 != 2) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 < local_d0);
    local_d0 = local_d0 * 2;
  }
  operator_delete((void *)local_100._0_8_,local_d0);
  operator_delete(local_f0,sStack_d8 * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_b8 = (undefined1  [8])local_50;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b8 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_100);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b8);
  local_100._0_8_ = (pointer)0x0;
  local_f0 = (size_t *)0x0;
  psStack_e8 = (size_t *)0x0;
  local_e0 = (size_t *)0x0;
  sStack_d8 = 0;
  local_d0 = 0;
  local_c8 = LastMajorOrder;
  local_c4 = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  if (local_c4 == false) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"Assertion failed.");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_100,
             (View<short,_false,_std::allocator<unsigned_long>_> *)local_b8);
  if (gStack_b0.size_ != local_d0) {
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar10,"test failed.");
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (gStack_b0.size_ == 0) {
    uVar13 = 0;
  }
  else {
    sVar14 = 0;
    do {
      psVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b8,sVar14);
      sVar1 = *psVar6;
      piVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,sVar14);
      if (*piVar8 != (int)sVar1) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 < gStack_b0.size_);
    uVar13 = local_d0 << 2;
  }
  operator_delete((void *)local_100._0_8_,uVar13);
  operator_delete(local_f0,sStack_d8 * 0x18);
  operator_delete(gStack_b0.shape_,gStack_b0.dimension_ * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_b8 = (undefined1  [8])local_50;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b8 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_100);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b8);
  local_100._0_8_ = (pointer)0x0;
  local_f0 = (size_t *)0x0;
  psStack_e8 = (size_t *)0x0;
  local_e0 = (size_t *)0x0;
  sStack_d8 = 0;
  local_d0 = 0;
  local_c8 = LastMajorOrder;
  local_c4 = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  if (local_c4 != false) {
    andres::
    BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
    ::BinaryViewExpression
              (&local_48,
               (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
               local_b8,(ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                         *)local_b8);
    andres::Marray<int,std::allocator<unsigned_long>>::operator=
              ((Marray<int,std::allocator<unsigned_long>> *)local_100,
               (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
                *)&local_48);
    if (gStack_b0.size_ != local_d0) {
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar10,"test failed.");
      __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (gStack_b0.size_ == 0) {
      uVar13 = 0;
    }
    else {
      sVar14 = 0;
      do {
        psVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b8,sVar14);
        sVar1 = *psVar6;
        psVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b8,sVar14);
        sVar2 = *psVar6;
        piVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,sVar14);
        if ((int)sVar2 + (int)sVar1 != *piVar8) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar10,"test failed.");
          __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 < gStack_b0.size_);
      uVar13 = local_d0 << 2;
    }
    operator_delete((void *)local_100._0_8_,uVar13);
    operator_delete(local_f0,sStack_d8 * 0x18);
    operator_delete(gStack_b0.shape_,gStack_b0.dimension_ * 0x18);
    local_68[0] = 3;
    local_68[1] = 2;
    local_68[2] = 4;
    local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffffffff0000);
    andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
              ((Marray<short,std::allocator<unsigned_long>> *)local_100,local_68,
               (unsigned_long *)&local_50,(short *)local_b8,&andres::defaultOrder,
               (allocator_type *)&local_48);
    local_b8 = (undefined1  [8])0x0;
    gStack_b0.shape_ = (size_t *)0x0;
    gStack_b0.shapeStrides_ = (size_t *)0x0;
    gStack_b0.strides_ = (size_t *)0x0;
    gStack_b0.dimension_ = 0;
    gStack_b0.size_ = 0;
    gStack_b0.coordinateOrder_ = LastMajorOrder;
    gStack_b0.isSimple_ = true;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8);
    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8);
    if (gStack_b0.isSimple_ != false) {
      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                ((Marray<int,std::allocator<unsigned_long>> *)local_b8,
                 (View<short,_false,_std::allocator<unsigned_long>_> *)local_100);
      if (gStack_b0.size_ != local_d0) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      if (gStack_b0.size_ == 0) {
        uVar13 = 0;
      }
      else {
        sVar14 = 0;
        do {
          piVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8,sVar14);
          iVar36 = *piVar8;
          psVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<short,_false,_std::allocator<unsigned_long>_> *)local_100,sVar14
                             );
          if (iVar36 != *psVar6) {
            plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar10,"test failed.");
            __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          sVar14 = sVar14 + 1;
        } while (sVar14 < gStack_b0.size_);
        uVar13 = gStack_b0.size_ << 2;
      }
      operator_delete((void *)local_b8,uVar13);
      operator_delete(gStack_b0.shape_,gStack_b0.dimension_ * 0x18);
      operator_delete((void *)local_100._0_8_,local_d0 * 2);
      operator_delete(local_f0,sStack_d8 * 0x18);
      return;
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"Assertion failed.");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar11,"Assertion failed.");
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DifferingTypesTest::assignmentTest()
{
    // View
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            v = 2;
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == 2);
            }
        }
        // from View
        { 
            // compilers may issue a warning here
            if(sizeof(float) == sizeof(int)) {
                std::size_t shape[] = {3, 2, 4};
                andres::View<int> v(shape, shape+3, dataInt_);
                andres::View<float, true> w;
                w = v;
                for(std::size_t j=0; j<v.size(); ++j) {
                    test( w(j) == *static_cast<float*>(
                        static_cast<void*>(&dataInt_[j])));
                }
            }
        }
        // from ViewExpression
        { 
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::View<int> w(shape, shape+3, dataInt_);
            w = v + v;
            for(std::size_t j=0; j<w.size(); ++j) {
                test(w(j) == (v + v)(j));
            }
        }
    }
    // Marray
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            m = 2;
            for(std::size_t j=0; j<m.size(); ++j) {
                test(m(j) == 2);
            }
        }
        // from View 
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == m(j));
            }
        }
        // from ViewExpression
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v + v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j)+v(j) == m(j));
            }
        }
        // from Marray
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            andres::Marray<int> n;
            n = m;
            test(n.size() == m.size());
            for(std::size_t j=0; j<n.size(); ++j) {
                test(n(j) == m(j));
            }
        }
    }
}